

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall graphics101::Mesh::computeNormalsHalfEdge(Mesh *this,MeshNormalStrategy strategy)

{
  pointer *__x;
  size_type sVar1;
  undefined1 local_d8 [8];
  HalfEdgeTriMesh halfedges;
  undefined1 local_38 [8];
  Edges edges;
  MeshNormalStrategy strategy_local;
  Mesh *this_local;
  
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::clear(&this->normals);
  sVar1 = std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::size(&this->positions);
  __x = &edges.
         super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>((vec<3,float,(glm::qualifier)0> *)__x,0,0,0)
  ;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(&this->normals,sVar1,(value_type *)__x);
  std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::operator=
            (&this->face_normals,&this->face_positions);
  std::
  vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
            *)local_38);
  unordered_edges_from_triangles
            (&this->face_positions,
             (vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
              *)local_38);
  HalfEdgeTriMesh::HalfEdgeTriMesh((HalfEdgeTriMesh *)local_d8);
  sVar1 = std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::size(&this->positions);
  HalfEdgeTriMesh::build((HalfEdgeTriMesh *)local_d8,sVar1,&this->face_positions,(Edges *)local_38);
  HalfEdgeTriMesh::~HalfEdgeTriMesh((HalfEdgeTriMesh *)local_d8);
  std::
  vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             *)local_38);
  return;
}

Assistant:

void Mesh::computeNormalsHalfEdge( MeshNormalStrategy strategy ) {
    
    // Clear any existing normals.
    normals.clear();
    // Make space for a normal for each position. Initialize them to 0.
    normals.resize( positions.size(), vec3(0,0,0) );
    // Since there is a normal for each position, face_normals should be identical
    // to face_positions.
    face_normals = face_positions;
    
    // Build the halfedges.
    typedef HalfEdgeTriMesh::Index Index;
    HalfEdgeTriMesh::Edges edges;
    unordered_edges_from_triangles( face_positions, edges );
    HalfEdgeTriMesh halfedges;
    halfedges.build( positions.size(), face_positions, edges );
    // You will use halfedges to collect all incident faces at a vertex with:
    //     halfedges.vertex_face_neighbors( vertex_index );
    
    // Your code goes here.
    
    // Iterate over vertices.
    
    // Normalize all normals.
    
}